

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O1

stumpless_target * new_target(stumpless_target_type type,char *name)

{
  int iVar1;
  stumpless_target *__ptr;
  char *pcVar2;
  config_mutex_t *pcVar3;
  
  __ptr = (stumpless_target *)alloc_mem(0xa0);
  if (__ptr != (stumpless_target *)0x0) {
    pcVar2 = copy_cstring_with_length(name,&__ptr->name_length);
    __ptr->name = pcVar2;
    if (pcVar2 != (char *)0x0) {
      pcVar3 = thread_safety_new_mutex();
      __ptr->mutex = pcVar3;
      if (pcVar3 != (config_mutex_t *)0x0) {
        __ptr->id = (stumpless_id_t)0x0;
        __ptr->type = type;
        iVar1 = stdatomic_read_int(&default_option);
        __ptr->options = iVar1;
        iVar1 = get_prival(STUMPLESS_FACILITY_USER,STUMPLESS_SEVERITY_INFO);
        __ptr->default_prival = iVar1;
        __ptr->default_app_name[0] = '-';
        __ptr->default_app_name_length = 1;
        __ptr->default_msgid[0] = '-';
        __ptr->default_msgid_length = 1;
        __ptr->mask = 0xff;
        __ptr->filter = stumpless_mask_filter;
        return __ptr;
      }
      free_mem(__ptr->name);
    }
    free_mem(__ptr);
  }
  return (stumpless_target *)0x0;
}

Assistant:

struct stumpless_target *
new_target( enum stumpless_target_type type, const char *name ) {
  struct stumpless_target *target;

  target = alloc_mem( sizeof( *target ) );
  if( !target ) {
    goto fail;
  }

  target->name = copy_cstring_with_length( name, &target->name_length );
  if( !target->name ) {
    goto fail_name;
  }

  config_assign_cached_mutex( target->mutex );
  if( !config_check_mutex_valid( target->mutex ) ) {
    goto fail_mutex;
  }

  target->id = NULL;
  target->type = type;
  target->options = stumpless_get_default_options(  );
  target->default_prival = get_prival( STUMPLESS_DEFAULT_FACILITY,
                                       STUMPLESS_DEFAULT_SEVERITY );
  target->default_app_name[0] = '-';
  target->default_app_name_length = 1;
  target->default_msgid[0] = '-';
  target->default_msgid_length = 1;
  target->mask = STUMPLESS_SEVERITY_MASK_UPTO( STUMPLESS_SEVERITY_DEBUG_VALUE );
  target->filter = stumpless_mask_filter;

  return target;

fail_mutex:
  free_mem( target->name );
fail_name:
  free_mem( target );
fail:
  return NULL;
}